

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O0

void Cba_ManCreatePrimMap(char **pMap)

{
  char **pMap_local;
  
  memset(pMap,0,0x2d0);
  pMap[0x58] = "sli";
  pMap[0x59] = "icc";
  pMap[8] = "";
  pMap[9] = "~";
  pMap[10] = "&";
  pMap[0xb] = "&";
  pMap[0xc] = "|";
  pMap[0xd] = "|";
  pMap[0xe] = "^";
  pMap[0xf] = "^";
  pMap[0x10] = "&";
  pMap[0x11] = "&";
  pMap[0x12] = "?";
  pMap[0x13] = "maj";
  pMap[0x1b] = "&";
  pMap[0x1c] = "~&";
  pMap[0x1d] = "|";
  pMap[0x1e] = "~|";
  pMap[0x1f] = "^";
  pMap[0x20] = "~^";
  pMap[0x21] = "!";
  pMap[0x22] = "&&";
  pMap[0x23] = "logic nand";
  pMap[0x24] = "||";
  pMap[0x25] = "logic nor";
  pMap[0x26] = "^^";
  pMap[0x27] = "logic xnor";
  pMap[0x28] = "nmux";
  pMap[0x29] = "sel";
  pMap[0x2a] = "prio-select";
  pMap[0x2b] = "enc";
  pMap[0x2c] = "prio-enc";
  pMap[0x2d] = "dec";
  pMap[0x2e] = "enable-dec";
  pMap[0x2f] = "+";
  pMap[0x30] = "-";
  pMap[0x31] = "*";
  pMap[0x33] = "/";
  pMap[0x34] = "%";
  pMap[0x35] = "%";
  pMap[0x36] = "**";
  pMap[0x37] = "-";
  pMap[0x38] = "@";
  pMap[0x39] = "abs";
  pMap[0x3b] = "<";
  pMap[0x3c] = "<=";
  pMap[0x3d] = ">=";
  pMap[0x3e] = ">";
  pMap[0x3f] = "==";
  pMap[0x40] = "!=";
  pMap[0x41] = "<<";
  pMap[0x42] = ">>";
  pMap[0x43] = "<<<";
  pMap[0x44] = ">>>";
  pMap[0x45] = "rotL";
  pMap[0x46] = "rotR";
  pMap[0x4b] = "tri";
  pMap[0x4c] = "ram";
  pMap[0x4d] = "ramR";
  pMap[0x4e] = "ramW";
  pMap[0x4f] = "ramWC";
  pMap[0x52] = "ramBox";
  pMap[0x53] = "lat";
  pMap[0x54] = "latrs";
  pMap[0x55] = "dff";
  pMap[0x57] = "dffrs";
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************
  
  Synopsis    []  
  
  Description []  
                 
  SideEffects []  
  
  SeeAlso     []  
  
***********************************************************************/
void Cba_ManCreatePrimMap( char ** pMap )
{
    memset( pMap, 0, sizeof(char *) * CBA_BOX_LAST );

    pMap[ CBA_BOX_SLICE  ] = "sli";
    pMap[ CBA_BOX_CONCAT ] = "icc";

    pMap[ CBA_BOX_BUF    ] = "";
    pMap[ CBA_BOX_INV    ] = "~";
    pMap[ CBA_BOX_AND    ] = "&"; 
    pMap[ CBA_BOX_NAND   ] = "&"; 
    pMap[ CBA_BOX_OR     ] = "|"; 
    pMap[ CBA_BOX_NOR    ] = "|"; 
    pMap[ CBA_BOX_XOR    ] = "^"; 
    pMap[ CBA_BOX_XNOR   ] = "^"; 
    pMap[ CBA_BOX_SHARP  ] = "&"; 
    pMap[ CBA_BOX_SHARPL ] = "&"; 
    pMap[ CBA_BOX_MUX    ] = "?"; 
    pMap[ CBA_BOX_MAJ    ] = "maj"; 
    pMap[ CBA_BOX_RAND   ] = "&"; 
    pMap[ CBA_BOX_RNAND  ] = "~&"; 
    pMap[ CBA_BOX_ROR    ] = "|"; 
    pMap[ CBA_BOX_RNOR   ] = "~|"; 
    pMap[ CBA_BOX_RXOR   ] = "^"; 
    pMap[ CBA_BOX_RXNOR  ] = "~^"; 
    pMap[ CBA_BOX_LNOT   ] = "!"; 
    pMap[ CBA_BOX_LAND   ] = "&&"; 
    pMap[ CBA_BOX_LNAND  ] = "logic nand"; 
    pMap[ CBA_BOX_LOR    ] = "||"; 
    pMap[ CBA_BOX_LNOR   ] = "logic nor"; 
    pMap[ CBA_BOX_LXOR   ] = "^^"; 
    pMap[ CBA_BOX_LXNOR  ] = "logic xnor"; 
    pMap[ CBA_BOX_NMUX   ] = "nmux"; 
    pMap[ CBA_BOX_SEL    ] = "sel"; 
    pMap[ CBA_BOX_PSEL   ] = "prio-select"; 
    pMap[ CBA_BOX_ENC    ] = "enc"; 
    pMap[ CBA_BOX_PENC   ] = "prio-enc"; 
    pMap[ CBA_BOX_DEC    ] = "dec"; 
    pMap[ CBA_BOX_EDEC   ] = "enable-dec"; 
    pMap[ CBA_BOX_ADD    ] = "+"; 
    pMap[ CBA_BOX_SUB    ] = "-"; 
    pMap[ CBA_BOX_MUL    ] = "*"; 
    pMap[ CBA_BOX_DIV    ] = "/"; 
    pMap[ CBA_BOX_MOD    ] = "%"; 
    pMap[ CBA_BOX_REM    ] = "%"; 
    pMap[ CBA_BOX_POW    ] = "**"; 
    pMap[ CBA_BOX_MIN    ] = "-"; 
    pMap[ CBA_BOX_SQRT   ] = "@"; 
    pMap[ CBA_BOX_ABS    ] = "abs"; 
    pMap[ CBA_BOX_LTHAN  ] = "<"; 
    pMap[ CBA_BOX_LETHAN ] = "<="; 
    pMap[ CBA_BOX_METHAN ] = ">="; 
    pMap[ CBA_BOX_MTHAN  ] = ">"; 
    pMap[ CBA_BOX_EQU    ] = "=="; 
    pMap[ CBA_BOX_NEQU   ] = "!="; 
    pMap[ CBA_BOX_SHIL   ] = "<<"; 
    pMap[ CBA_BOX_SHIR   ] = ">>"; 
    pMap[ CBA_BOX_SHILA  ] = "<<<"; 
    pMap[ CBA_BOX_SHIRA  ] = ">>>"; 
    pMap[ CBA_BOX_ROTL   ] = "rotL"; 
    pMap[ CBA_BOX_ROTR   ] = "rotR"; 

    pMap[ CBA_BOX_TRI    ] = "tri";
    pMap[ CBA_BOX_RAM    ] = "ram";
    pMap[ CBA_BOX_RAMR   ] = "ramR";
    pMap[ CBA_BOX_RAMW   ] = "ramW";
    pMap[ CBA_BOX_RAMWC  ] = "ramWC";
    pMap[ CBA_BOX_RAMBOX ] = "ramBox";

    pMap[ CBA_BOX_LATCH  ] = "lat";
    pMap[ CBA_BOX_LATCHRS] = "latrs";
    pMap[ CBA_BOX_DFF    ] = "dff";
    pMap[ CBA_BOX_DFFRS  ] = "dffrs";
}